

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseRAPass::assignRAInst
          (BaseRAPass *this,BaseNode *node,RABlock *block,RAInstBuilder *ib)

{
  RegMask *pRVar1;
  RATiedReg *pRVar2;
  RATiedFlags *pRVar3;
  byte bVar4;
  RAWorkReg *pRVar5;
  undefined8 uVar6;
  uint32_t uVar7;
  RATiedFlags RVar8;
  anon_union_4_2_a70401ef_for_RATiedReg_3 aVar9;
  RegMask RVar10;
  RegMask RVar11;
  Error EVar12;
  RAInst *pRVar13;
  RATiedReg *pRVar14;
  RAWorkReg **ppRVar15;
  uint *puVar16;
  byte *pbVar17;
  size_t index_00;
  ulong uVar18;
  RegGroup group;
  RATiedFlags local_68;
  RARegIndex index;
  
  uVar18 = (*(long *)(ib + 0x38) - (long)ib) - 0x40U >> 5;
  pRVar13 = newRAInst(this,block,*(InstRWFlags *)(ib + 4),*(RATiedFlags *)(ib + 8),(uint32_t)uVar18,
                      (RARegMask *)(ib + 0x28));
  if (pRVar13 == (RAInst *)0x0) {
    EVar12 = 1;
  }
  else {
    local_68 = ~*(uint *)(ib + 0xc);
    RARegIndex::buildIndexes(&index,(RARegCount *)(ib + 0x10));
    (pRVar13->_tiedIndex).super_RARegCount.field_0 =
         (anon_union_4_2_ebeb14a8_for_RARegCount_0)index.super_RARegCount.field_0;
    (pRVar13->_tiedCount).field_0 = *(anon_union_4_2_ebeb14a8_for_RARegCount_0 *)(ib + 0x10);
    for (index_00 = 0; (uVar18 & 0xffffffff) != index_00; index_00 = index_00 + 1) {
      pRVar14 = RAInstBuilder::operator[](ib,index_00);
      ppRVar15 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                           (&this->_workRegs,(ulong)pRVar14->_workId);
      pRVar5 = *ppRVar15;
      *(undefined8 *)(pRVar5 + 0x10) = 0;
      group = (byte)pRVar5[0x21] & kMaxValue;
      if ((pRVar14->field_3).field_0._useId != 0xff) {
        block[0xd] = (RABlock)((byte)block[0xd] | 8);
        bVar4 = (pRVar14->field_3).field_0._useId;
        puVar16 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                            (&(pRVar13->_usedRegs)._masks,&group);
        *puVar16 = *puVar16 | 1 << (bVar4 & 0x1f);
      }
      if ((pRVar14->field_3).field_0._outId != 0xff) {
        block[0xd] = (RABlock)((byte)block[0xd] | 8);
      }
      pbVar17 = RARegCount::operator[](&index.super_RARegCount,group);
      bVar4 = *pbVar17;
      *pbVar17 = bVar4 + 1;
      uVar7 = pRVar14->_consecutiveParent;
      RVar8 = pRVar14->_flags;
      aVar9 = pRVar14->field_3;
      RVar10 = pRVar14->_useRegMask;
      RVar11 = pRVar14->_outRegMask;
      uVar6 = *(undefined8 *)&pRVar14->_useRewriteMask;
      pRVar2 = pRVar13->_tiedRegs + bVar4;
      pRVar2->_workId = pRVar14->_workId;
      pRVar2->_consecutiveParent = uVar7;
      pRVar2->_flags = RVar8;
      pRVar2->field_3 = aVar9;
      pRVar2 = pRVar13->_tiedRegs + bVar4;
      pRVar2->_useRegMask = RVar10;
      pRVar2->_outRegMask = RVar11;
      *(undefined8 *)(&pRVar2->_useRegMask + 2) = uVar6;
      pRVar3 = &pRVar13->_tiedRegs[bVar4]._flags;
      *pRVar3 = *pRVar3 & local_68;
      if ((pRVar14->_flags & kDuplicate) == kNone) {
        puVar16 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                            ((Array<unsigned_int,_4UL> *)(ib + 0x18),&group);
        pRVar1 = &pRVar13->_tiedRegs[bVar4]._useRegMask;
        *pRVar1 = *pRVar1 & ~*puVar16;
      }
    }
    *(RAInst **)(node + 0x20) = pRVar13;
    EVar12 = 0;
  }
  return EVar12;
}

Assistant:

ASMJIT_FORCE_INLINE Error assignRAInst(BaseNode* node, RABlock* block, RAInstBuilder& ib) noexcept {
    uint32_t tiedRegCount = ib.tiedRegCount();
    RAInst* raInst = newRAInst(block, ib.instRWFlags(), ib.aggregatedFlags(), tiedRegCount, ib._clobbered);

    if (ASMJIT_UNLIKELY(!raInst))
      return DebugUtils::errored(kErrorOutOfMemory);

    RARegIndex index;
    RATiedFlags flagsFilter = ~ib.forbiddenFlags();

    index.buildIndexes(ib._count);
    raInst->_tiedIndex = index;
    raInst->_tiedCount = ib._count;

    for (uint32_t i = 0; i < tiedRegCount; i++) {
      RATiedReg* tiedReg = ib[i];
      RAWorkReg* workReg = workRegById(tiedReg->workId());

      workReg->resetTiedReg();
      RegGroup group = workReg->group();

      if (tiedReg->hasUseId()) {
        block->addFlags(RABlockFlags::kHasFixedRegs);
        raInst->_usedRegs[group] |= Support::bitMask(tiedReg->useId());
      }

      if (tiedReg->hasOutId()) {
        block->addFlags(RABlockFlags::kHasFixedRegs);
      }

      RATiedReg& dst = raInst->_tiedRegs[index[group]++];
      dst = *tiedReg;
      dst._flags &= flagsFilter;

      if (!tiedReg->isDuplicate())
        dst._useRegMask &= ~ib._used[group];
    }

    node->setPassData<RAInst>(raInst);
    return kErrorOk;
  }